

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.c
# Opt level: O2

_Bool ethash_compute_full_data
                (void *mem,uint64_t full_size,ethash_light_t light,ethash_callback_t callback)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  _Bool _Var4;
  double dVar5;
  double local_48;
  
  if ((full_size & 0x7f) == 0) {
    uVar3 = full_size >> 6;
    local_48 = 0.0;
    for (uVar2 = 0; _Var4 = ((uint)uVar3 & 0xfffffffe) == uVar2, !_Var4; uVar2 = uVar2 + 1) {
      if ((callback != (ethash_callback_t)0x0) &&
         ((int)((uVar2 & 0xffffffff) % ((uVar3 & 0xffffffff) / 100)) == 0)) {
        dVar5 = ceil(local_48 * 100.0);
        iVar1 = (*callback)((uint)(long)dVar5);
        if (iVar1 != 0) {
          return _Var4;
        }
      }
      local_48 = local_48 + (double)(1.0 / (float)(uVar3 & 0xffffffff));
      ethash_calculate_dag_item((node *)mem,(uint32_t)uVar2,light);
      mem = (void *)((long)mem + 0x40);
    }
  }
  else {
    _Var4 = false;
  }
  return _Var4;
}

Assistant:

bool ethash_compute_full_data(
	void* mem,
	uint64_t full_size,
	ethash_light_t const light,
	ethash_callback_t callback
)
{
	if (full_size % (sizeof(uint32_t) * MIX_WORDS) != 0 ||
		(full_size % sizeof(node)) != 0) {
		return false;
	}
	uint32_t const max_n = (uint32_t)(full_size / sizeof(node));
	node* full_nodes = mem;
	double const progress_change = 1.0f / max_n;
	double progress = 0.0f;
	// now compute full nodes
	for (uint32_t n = 0; n != max_n; ++n) {
		if (callback &&
			n % (max_n / 100) == 0 &&
			callback((unsigned int)(ceil(progress * 100.0f))) != 0) {

			return false;
		}
		progress += progress_change;
		ethash_calculate_dag_item(&(full_nodes[n]), n, light);
	}
	return true;
}